

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

ByteMaskType * __thiscall
hexpattern::decodechunk(ByteMaskType *__return_storage_ptr__,hexpattern *this,string *chunk)

{
  char c;
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *ppVar4;
  int iVar5;
  size_type sVar6;
  ByteVector data;
  ByteVector mask;
  byte local_72;
  byte local_71;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_71 = 0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_72 = 0;
  pcVar1 = (chunk->_M_dataplus)._M_p;
  sVar2 = chunk->_M_string_length;
  bVar3 = true;
  sVar6 = 0;
  local_70 = __return_storage_ptr__;
  do {
    ppVar4 = local_70;
    if (sVar2 == sVar6) {
      std::
      pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
                (local_70,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
      return ppVar4;
    }
    c = pcVar1[sVar6];
    iVar5 = convertnyble(c);
    if (iVar5 == -2) {
      if (bVar3) {
        local_71 = 0;
        local_72 = 0;
      }
      else {
LAB_0010d004:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,&local_71);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,&local_72);
      }
LAB_0010d020:
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else if (iVar5 != -1) {
      iVar5 = convertnyble(c);
      if (!bVar3) {
        local_71 = local_71 | (byte)iVar5;
        local_72 = local_72 | 0xf;
        goto LAB_0010d004;
      }
      local_71 = (byte)iVar5 << 4;
      local_72 = 0xf0;
      goto LAB_0010d020;
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

ByteMaskType decodechunk(const std::string& chunk)
    {
        ByteVector data;  uint8_t datavalue = 0;
        ByteVector mask;  uint8_t maskvalue = 0;

        bool hi = true;
        for (auto c : chunk)
        {
            int nyble = convertnyble(c);
            if (nyble == -1)
                continue;

            if (nyble == -2) {
                if (hi) {
                    datavalue = 0;
                    maskvalue = 0;
                }
            }
            else {
                int nyble = convertnyble(c);
                if (hi) {
                    datavalue = nyble << 4;
                    maskvalue = 0xF0;
                }
                else {
                    datavalue |= nyble;
                    maskvalue |= 0x0F;
                }
            }

            if (!hi) {
                data.push_back(datavalue);
                mask.push_back(maskvalue);
            }
            hi = !hi;
        }
        return std::make_pair(data, mask);
    }